

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

obj * hold_another_object(obj *obj,char *drop_fmt,char *drop_arg,char *hold_msg)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  long quan;
  bool bVar4;
  int local_154;
  int prev_encumbr;
  long oquan;
  boolean wasUpolyd;
  int oerode;
  boolean crysknife;
  char buf [256];
  char *hold_msg_local;
  char *drop_arg_local;
  char *drop_fmt_local;
  obj *obj_local;
  
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffdf | 0x20;
  }
  if (obj->oartifact != '\0') {
    sVar1 = obj->otyp;
    uVar2 = *(uint *)&obj->field_0x4a;
    bVar4 = u.umonnum != u.umonster;
    place_object(obj,level,(int)u.ux,(int)u.uy);
    iVar3 = touch_artifact(obj,&youmonst);
    if (iVar3 == 0) {
      obj_extract_self(obj);
      dropy(obj);
      return obj;
    }
    if ((bVar4) && (u.umonnum == u.umonster)) {
      if (drop_fmt != (char *)0x0) {
        pline(drop_fmt,drop_arg);
      }
      obj_extract_self(obj);
      dropy(obj);
      return obj;
    }
    obj_extract_self(obj);
    if (sVar1 == 0x1a) {
      obj->otyp = 0x1a;
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffefff | (uVar2 >> 0xc & 1) << 0xc
      ;
    }
  }
  if ((u.uprops[0x25].intrinsic == 0) && (u.uprops[0x25].extrinsic == 0)) {
    quan = (long)obj->quan;
    local_154 = near_capacity();
    if (local_154 < 2) {
      local_154 = 2;
    }
    hold_msg_local = drop_arg;
    if (drop_arg != (char *)0x0) {
      hold_msg_local = strcpy((char *)&oerode,drop_arg);
    }
    drop_fmt_local = (char *)addinv(obj);
    iVar3 = inv_cnt();
    if ((iVar3 < 0x35) &&
       (((((obj *)drop_fmt_local)->otyp == 0x210 &&
         ((*(uint *)&((obj *)drop_fmt_local)->field_0x4a & 1) != 0)) ||
        (iVar3 = near_capacity(), iVar3 <= local_154)))) {
      if ((((flags.autoquiver != '\0') && (uquiver == (obj *)0x0)) &&
          (((obj *)drop_fmt_local)->owornmask == 0)) &&
         (((((((obj *)drop_fmt_local)->oclass == '\x02' ||
             (((obj *)drop_fmt_local)->oclass == '\x06')) &&
            ((-0x1c < objects[((obj *)drop_fmt_local)->otyp].oc_subtyp &&
             (objects[((obj *)drop_fmt_local)->otyp].oc_subtyp < -0x18)))) ||
           (((((((obj *)drop_fmt_local)->oclass == '\x02' ||
               (((obj *)drop_fmt_local)->oclass == '\r')) &&
              (-0x19 < objects[((obj *)drop_fmt_local)->otyp].oc_subtyp)) &&
             ((objects[((obj *)drop_fmt_local)->otyp].oc_subtyp < -0x15 && (uwep != (obj *)0x0))))
            && ((int)objects[((obj *)drop_fmt_local)->otyp].oc_subtyp ==
                -(int)objects[uwep->otyp].oc_subtyp)))) ||
          (((((obj *)drop_fmt_local)->oclass == '\x02' || (((obj *)drop_fmt_local)->oclass == '\r'))
           && ((-0x19 < objects[((obj *)drop_fmt_local)->otyp].oc_subtyp &&
               (((objects[((obj *)drop_fmt_local)->otyp].oc_subtyp < -0x15 &&
                 (uswapwep != (obj *)0x0)) &&
                ((int)objects[((obj *)drop_fmt_local)->otyp].oc_subtyp ==
                 -(int)objects[uswapwep->otyp].oc_subtyp)))))))))) {
        setuqwep((obj *)drop_fmt_local);
      }
      if ((hold_msg != (char *)0x0) || (drop_fmt != (char *)0x0)) {
        prinv(hold_msg,(obj *)drop_fmt_local,quan);
      }
    }
    else {
      if (drop_fmt != (char *)0x0) {
        pline(drop_fmt,hold_msg_local);
      }
      if (quan < ((obj *)drop_fmt_local)->quan) {
        drop_fmt_local = (char *)splitobj((obj *)drop_fmt_local,quan);
      }
      dropx((obj *)drop_fmt_local);
    }
  }
  else {
    if (drop_fmt != (char *)0x0) {
      pline(drop_fmt,drop_arg);
    }
    dropy(obj);
    drop_fmt_local = (char *)obj;
  }
  return (obj *)drop_fmt_local;
}

Assistant:

struct obj *hold_another_object(struct obj *obj, const char *drop_fmt,
				const char *drop_arg, const char *hold_msg)
{
	char buf[BUFSZ];

	if (!Blind) obj->dknown = 1;	/* maximize mergibility */
	if (obj->oartifact) {
	    /* place_object may change these */
	    boolean crysknife = (obj->otyp == CRYSKNIFE);
	    int oerode = obj->oerodeproof;
	    boolean wasUpolyd = Upolyd;

	    /* in case touching this object turns out to be fatal */
	    place_object(obj, level, u.ux, u.uy);

	    if (!touch_artifact(obj, &youmonst)) {
		obj_extract_self(obj);	/* remove it from the floor */
		dropy(obj);		/* now put it back again :-) */
		return obj;
	    } else if (wasUpolyd && !Upolyd) {
		/* loose your grip if you revert your form */
		if (drop_fmt) pline(drop_fmt, drop_arg);
		obj_extract_self(obj);
		dropy(obj);
		return obj;
	    }
	    obj_extract_self(obj);
	    if (crysknife) {
		obj->otyp = CRYSKNIFE;
		obj->oerodeproof = oerode;
	    }
	}
	if (Fumbling) {
	    if (drop_fmt) pline(drop_fmt, drop_arg);
	    dropy(obj);
	} else {
	    long oquan = obj->quan;
	    int prev_encumbr = near_capacity();	/* before addinv() */

	    /* encumbrance only matters if it would now become worse
	       than max( current_value, stressed ) */
	    if (prev_encumbr < MOD_ENCUMBER) prev_encumbr = MOD_ENCUMBER;
	    /* addinv() may redraw the entire inventory, overwriting
	       drop_arg when it comes from something like doname() */
	    if (drop_arg) drop_arg = strcpy(buf, drop_arg);

	    obj = addinv(obj);
	    if (inv_cnt() > 52
		    || ((obj->otyp != LOADSTONE || !obj->cursed)
			&& near_capacity() > prev_encumbr)) {
		if (drop_fmt) pline(drop_fmt, drop_arg);
		/* undo any merge which took place */
		if (obj->quan > oquan) obj = splitobj(obj, oquan);
		dropx(obj);
	    } else {
		if (flags.autoquiver && !uquiver && !obj->owornmask &&
			(is_missile(obj) ||
			    ammo_and_launcher(obj, uwep) ||
			    ammo_and_launcher(obj, uswapwep)))
		    setuqwep(obj);
		if (hold_msg || drop_fmt) prinv(hold_msg, obj, oquan);
	    }
	}
	return obj;
}